

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

void __thiscall lest::confirm::~confirm(confirm *this)

{
  pointer pcVar1;
  ostream *poVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  char *local_e8;
  long local_e0;
  char local_d8 [16];
  char *local_c8;
  long local_c0;
  char local_b8 [16];
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  if (this->failures < 1) {
    if ((this->output).opt.pass != true) goto LAB_00105af5;
    poVar2 = (this->super_action).os;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"All ",4);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->selected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," selected ",10);
    puVar4 = local_98;
    local_a8 = puVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"test","");
    if (this->selected == 1) {
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_a8,local_a8 + local_a0);
    }
    else {
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_a8,local_a8 + local_a0);
      std::__cxx11::string::append((char *)&local_e8);
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_e8,local_e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"passed.\n","");
    local_c8 = local_b8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_68,local_68 + local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_c8,local_c0);
    if (local_c8 != local_b8) {
      operator_delete(local_c8);
    }
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
    puVar3 = local_a8;
    if (local_e8 != local_d8) {
      operator_delete(local_e8);
      puVar3 = local_a8;
    }
  }
  else {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)(this->super_action).os,this->failures);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," out of ",8);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->selected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," selected ",10);
    puVar4 = local_78;
    local_88 = puVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"test","");
    if (this->selected == 1) {
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_88,local_88 + local_80);
    }
    else {
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_88,local_88 + local_80);
      std::__cxx11::string::append((char *)&local_e8);
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_e8,local_e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"failed.\n","");
    local_c8 = local_b8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_48,local_48 + local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_c8,local_c0);
    if (local_c8 != local_b8) {
      operator_delete(local_c8);
    }
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    puVar3 = local_88;
    if (local_e8 != local_d8) {
      operator_delete(local_e8);
      puVar3 = local_88;
    }
  }
  if (puVar3 != puVar4) {
    operator_delete(puVar3);
  }
LAB_00105af5:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->output).ctx);
  pcVar1 = (this->output).testing._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->output).testing.field_2) {
    operator_delete(pcVar1);
  }
  return;
}

Assistant:

~confirm()
    {
        if ( failures > 0 )
        {
            os << failures << " out of " << selected << " selected " << pluralise("test", selected) << " " << colourise( "failed.\n" );
        }
        else if ( output.pass() )
        {
            os << "All " << selected << " selected " << pluralise("test", selected) << " " << colourise( "passed.\n" );
        }
    }